

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O3

vector<float,_std::allocator<float>_> *
irwincolor::lab2xyz(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *lab)

{
  float fVar1;
  float *pfVar2;
  pointer pfVar3;
  value_type_conflict3 *__val;
  double dVar4;
  double __x;
  
  pfVar3 = (pointer)operator_new(0xc);
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = pfVar3;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar3 + 3;
  *pfVar3 = 0.0;
  pfVar3[1] = 0.0;
  pfVar3[2] = 0.0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = pfVar3 + 3;
  pfVar2 = (lab->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  __x = (double)((*pfVar2 + 16.0) / 116.0);
  fVar1 = pfVar2[2];
  dVar4 = (double)(float)((double)pfVar2[1] / 500.0 + __x);
  if (dVar4 <= 0.206893) {
    dVar4 = (dVar4 + -0.13793103448275862) / 7.787;
  }
  else {
    dVar4 = pow(dVar4,3.0);
  }
  *pfVar3 = (float)dVar4 * 95.047;
  if (__x <= 0.206893) {
    dVar4 = (__x + -0.13793103448275862) / 7.787;
  }
  else {
    dVar4 = pow(__x,3.0);
  }
  pfVar3[1] = (float)dVar4 * 100.0;
  dVar4 = (double)(float)((double)fVar1 / -200.0 + __x);
  if (dVar4 <= 0.206893) {
    dVar4 = (dVar4 + -0.13793103448275862) / 7.787;
  }
  else {
    dVar4 = pow(dVar4,3.0);
  }
  pfVar3[2] = (float)dVar4 * 108.883;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> lab2xyz(const std::vector<float>& lab)
{
	std::vector<float> xyz(3);
	float fy = (lab[0] + 16.0) / 116.0;
	float fx = lab[1] / 500.0 + fy;
	float fz = fy - lab[2] / 200.0;
	const float xn = 95.047, yn = 100.0, zn = 108.883;
	xyz[0] = labFuncInv(fx) * xn;
	xyz[1] = labFuncInv(fy) * yn;
	xyz[2] = labFuncInv(fz) * zn;
	//std::cout << "lab2xyz: xyz = " << xyz << std::endl;
	return xyz;
}